

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O2

void __thiscall SubExpr::print(SubExpr *this)

{
  Token local_80;
  
  Token::Token(&local_80,&(this->super_ExprNode)._token);
  Token::print(&local_80);
  Token::~Token(&local_80);
  std::operator<<((ostream *)&std::cout,'[');
  (**this->_test->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout,']');
  return;
}

Assistant:

void SubExpr::print() {
    token().print();
    std::cout << '[';
    _test->print();//index
    std::cout << ']';
}